

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

char * io_read_all_str(IOHANDLE io)

{
  int iVar1;
  long in_FS_OFFSET;
  uint len;
  void *buffer;
  uint local_24;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  io_read_all(io,&local_20,&local_24);
  iVar1 = mem_has_null(local_20,local_24);
  if (iVar1 != 0) {
    free(local_20);
    local_20 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

char *io_read_all_str(IOHANDLE io)
{
	void *buffer;
	unsigned len;

	io_read_all(io, &buffer, &len);
	if(mem_has_null(buffer, len))
	{
		free(buffer);
		return 0;
	}
	return buffer;
}